

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void counting_callback_fn(char *str,void *data)

{
  undefined8 *puVar1;
  
  if (*data != 0x7fffffff) {
    *(int *)data = *data + 1;
    return;
  }
  counting_callback_fn_cold_1();
  if (str != (char *)0x0) {
    secp256k1_scratch_create((secp256k1_callback *)(str + 0xd0),(size_t)data);
    return;
  }
  secp256k1_scratch_space_create_cold_1();
  if (str != (char *)0x0) {
    secp256k1_scratch_destroy((secp256k1_callback *)(str + 0xd0),(secp256k1_scratch *)data);
    return;
  }
  secp256k1_scratch_space_destroy_cold_1();
  puVar1 = (undefined8 *)malloc((size_t)((long)data + 0x20));
  if (puVar1 == (undefined8 *)0x0) {
    (**(code **)str)("Out of memory",*(undefined8 *)(str + 8));
  }
  else {
    puVar1[2] = 0;
    *puVar1 = 0x68637461726373;
    puVar1[1] = puVar1 + 4;
    puVar1[3] = data;
  }
  return;
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}